

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  ulong uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  Geometry *geometry;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar67;
  float fVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  undefined1 auVar66 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar77;
  float fVar79;
  float fVar80;
  undefined1 auVar78 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined1 local_1600 [16];
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong *local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  long local_1588;
  long local_1580;
  long local_1578;
  undefined1 local_1570 [16];
  RTCFilterFunctionNArguments local_1560;
  undefined1 local_1530 [16];
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined4 local_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined4 local_13e0;
  undefined4 uStack_13dc;
  undefined4 uStack_13d8;
  undefined4 uStack_13d4;
  undefined4 local_13d0;
  undefined4 uStack_13cc;
  undefined4 uStack_13c8;
  undefined4 uStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 local_1390 [16];
  uint local_1380;
  uint uStack_137c;
  uint uStack_1378;
  uint uStack_1374;
  uint uStack_1370;
  uint uStack_136c;
  uint uStack_1368;
  uint uStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_15c0 = local_11f8;
  local_1200 = root.ptr;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar93 = ZEXT3264(auVar45);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar94 = ZEXT3264(auVar46);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar95 = ZEXT3264(auVar47);
  auVar43 = vmulss_avx512f(auVar45._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar48._0_4_ = auVar43._0_4_;
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar48._16_4_ = auVar48._0_4_;
  auVar48._20_4_ = auVar48._0_4_;
  auVar48._24_4_ = auVar48._0_4_;
  auVar48._28_4_ = auVar48._0_4_;
  auVar43 = vmulss_avx512f(auVar46._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar58._0_4_ = auVar43._0_4_;
  auVar58._4_4_ = auVar58._0_4_;
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._0_4_;
  auVar58._16_4_ = auVar58._0_4_;
  auVar58._20_4_ = auVar58._0_4_;
  auVar58._24_4_ = auVar58._0_4_;
  auVar58._28_4_ = auVar58._0_4_;
  auVar43 = vmulss_avx512f(auVar47._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar47._0_4_ = auVar43._0_4_;
  auVar47._4_4_ = auVar47._0_4_;
  auVar47._8_4_ = auVar47._0_4_;
  auVar47._12_4_ = auVar47._0_4_;
  auVar47._16_4_ = auVar47._0_4_;
  auVar47._20_4_ = auVar47._0_4_;
  auVar47._24_4_ = auVar47._0_4_;
  auVar47._28_4_ = auVar47._0_4_;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = uVar33 ^ 0x20;
  uVar40 = uVar34 ^ 0x20;
  uVar39 = uVar35 ^ 0x20;
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar96 = ZEXT3264(auVar45);
  auVar46 = vxorps_avx512vl(auVar48,auVar45);
  auVar97 = ZEXT3264(auVar46);
  auVar46 = vxorps_avx512vl(auVar58,auVar45);
  auVar98 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar99 = ZEXT3264(auVar46);
  auVar46 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar100 = ZEXT3264(auVar46);
  auVar45 = vxorps_avx512vl(auVar47,auVar45);
  auVar101 = ZEXT3264(auVar45);
  local_1590 = uVar33 >> 2;
  local_1598 = uVar36 >> 2;
  local_15a0 = uVar34 >> 2;
  local_15a8 = uVar40 >> 2;
  local_15b0 = uVar35 >> 2;
  local_15b8 = uVar39 >> 2;
  auVar43 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar102 = ZEXT1664(auVar43);
  auVar43 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar103 = ZEXT1664(auVar43);
  bVar42 = true;
  local_15f0 = uVar39;
  local_15e8 = uVar40;
  local_15e0 = uVar36;
  local_15d8 = uVar35;
  local_15d0 = uVar34;
  local_15c8 = uVar33;
  do {
    uVar38 = local_15c0[-1];
    local_15c0 = local_15c0 + -1;
    while ((uVar38 & 8) == 0) {
      auVar45 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar33),auVar97._0_32_,
                           auVar93._0_32_);
      auVar46 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar34),auVar98._0_32_,
                           auVar94._0_32_);
      auVar45 = vpmaxsd_avx2(auVar45,auVar46);
      auVar47 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar35),auVar101._0_32_,
                           auVar95._0_32_);
      auVar46 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar36),auVar97._0_32_,
                           auVar93._0_32_);
      auVar48 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar40),auVar98._0_32_,
                           auVar94._0_32_);
      auVar46 = vpminsd_avx2(auVar46,auVar48);
      auVar48 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar38 + 0x40 + uVar39),auVar101._0_32_,
                           auVar95._0_32_);
      auVar47 = vpmaxsd_avx512vl(auVar47,auVar99._0_32_);
      auVar45 = vpmaxsd_avx2(auVar45,auVar47);
      auVar47 = vpminsd_avx512vl(auVar48,auVar100._0_32_);
      auVar46 = vpminsd_avx2(auVar46,auVar47);
      uVar30 = vpcmpd_avx512vl(auVar45,auVar46,2);
      if ((char)uVar30 == '\0') {
        bVar42 = local_15c0 != &local_1200;
        goto joined_r0x007b8012;
      }
      uVar27 = uVar38 & 0xfffffffffffffff0;
      lVar28 = 0;
      for (uVar38 = uVar30; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar38 = *(ulong *)(uVar27 + lVar28 * 8);
      uVar29 = (uint)uVar30 - 1 & (uint)uVar30;
      uVar30 = (ulong)uVar29;
      if (uVar29 != 0) {
        *local_15c0 = uVar38;
        lVar28 = 0;
        for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar28 = lVar28 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar30 = (ulong)uVar29;
        bVar41 = uVar29 == 0;
        while( true ) {
          local_15c0 = local_15c0 + 1;
          uVar38 = *(ulong *)(uVar27 + lVar28 * 8);
          if (bVar41) break;
          *local_15c0 = uVar38;
          lVar28 = 0;
          for (uVar38 = uVar30; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
            lVar28 = lVar28 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          bVar41 = uVar30 == 0;
        }
      }
    }
    local_1588 = (ulong)((uint)uVar38 & 0xf) - 8;
    if (local_1588 != 0) {
      uVar38 = uVar38 & 0xfffffffffffffff0;
      local_1580 = 0;
      do {
        lVar28 = local_1580 * 0x90;
        local_1578 = uVar38 + lVar28;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)(uVar38 + 0x40 + lVar28);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(uVar38 + 0x48 + lVar28);
        uVar18 = vpcmpub_avx512vl(auVar59,auVar63,2);
        uVar1 = *(undefined4 *)(uVar38 + 0x70 + lVar28);
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        auVar46._16_4_ = uVar1;
        auVar46._20_4_ = uVar1;
        auVar46._24_4_ = uVar1;
        auVar46._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar38 + 0x7c + lVar28);
        auVar51._4_4_ = uVar1;
        auVar51._0_4_ = uVar1;
        auVar51._8_4_ = uVar1;
        auVar51._12_4_ = uVar1;
        auVar51._16_4_ = uVar1;
        auVar51._20_4_ = uVar1;
        auVar51._24_4_ = uVar1;
        auVar51._28_4_ = uVar1;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(local_1590 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar43);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar43 = vfmadd213ps_fma(auVar45,auVar51,auVar46);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = *(ulong *)(local_1598 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar65);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar65 = vfmadd213ps_fma(auVar45,auVar51,auVar46);
        uVar1 = *(undefined4 *)(uVar38 + 0x74 + lVar28);
        auVar57._4_4_ = uVar1;
        auVar57._0_4_ = uVar1;
        auVar57._8_4_ = uVar1;
        auVar57._12_4_ = uVar1;
        auVar57._16_4_ = uVar1;
        auVar57._20_4_ = uVar1;
        auVar57._24_4_ = uVar1;
        auVar57._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar38 + 0x80 + lVar28);
        auVar53._4_4_ = uVar1;
        auVar53._0_4_ = uVar1;
        auVar53._8_4_ = uVar1;
        auVar53._12_4_ = uVar1;
        auVar53._16_4_ = uVar1;
        auVar53._20_4_ = uVar1;
        auVar53._24_4_ = uVar1;
        auVar53._28_4_ = uVar1;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(local_15a0 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar44);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar44 = vfmadd213ps_fma(auVar45,auVar53,auVar57);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(local_15a8 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar2);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar2 = vfmadd213ps_fma(auVar45,auVar53,auVar57);
        uVar1 = *(undefined4 *)(uVar38 + 0x78 + lVar28);
        auVar52._4_4_ = uVar1;
        auVar52._0_4_ = uVar1;
        auVar52._8_4_ = uVar1;
        auVar52._12_4_ = uVar1;
        auVar52._16_4_ = uVar1;
        auVar52._20_4_ = uVar1;
        auVar52._24_4_ = uVar1;
        auVar52._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar38 + 0x84 + lVar28);
        auVar49._4_4_ = uVar1;
        auVar49._0_4_ = uVar1;
        auVar49._8_4_ = uVar1;
        auVar49._12_4_ = uVar1;
        auVar49._16_4_ = uVar1;
        auVar49._20_4_ = uVar1;
        auVar49._24_4_ = uVar1;
        auVar49._28_4_ = uVar1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(local_15b0 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar3);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar3 = vfmadd213ps_fma(auVar45,auVar49,auVar52);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(local_15b8 + 0x40 + local_1578);
        auVar45 = vpmovzxbd_avx2(auVar4);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar4 = vfmadd213ps_fma(auVar45,auVar49,auVar52);
        auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar93._0_32_,auVar97._0_32_);
        auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar94._0_32_,auVar98._0_32_);
        auVar45 = vpmaxsd_avx2(auVar45,auVar46);
        auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar3),auVar95._0_32_,auVar101._0_32_);
        auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar65),auVar93._0_32_,auVar97._0_32_);
        auVar48 = vfmadd213ps_avx512vl(ZEXT1632(auVar2),auVar94._0_32_,auVar98._0_32_);
        auVar46 = vpminsd_avx2(auVar46,auVar48);
        auVar48 = vfmadd213ps_avx512vl(ZEXT1632(auVar4),auVar95._0_32_,auVar101._0_32_);
        auVar47 = vpmaxsd_avx512vl(auVar47,auVar99._0_32_);
        auVar45 = vpmaxsd_avx2(auVar45,auVar47);
        auVar47 = vpminsd_avx512vl(auVar48,auVar100._0_32_);
        auVar46 = vpminsd_avx2(auVar46,auVar47);
        uVar19 = vpcmpd_avx512vl(auVar45,auVar46,2);
        if ((byte)((byte)uVar19 & (byte)uVar18) != 0) {
          uVar33 = (ulong)(byte)((byte)uVar19 & (byte)uVar18);
          do {
            lVar28 = 0;
            for (uVar34 = uVar33; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            pGVar5 = (context->scene->geometries).items[*(uint *)(local_1578 + 0x88)].ptr;
            lVar6 = *(long *)&pGVar5->field_0x58;
            lVar7 = *(long *)&pGVar5[1].time_range.upper;
            lVar32 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)*(uint *)(local_1578 + 4 + lVar28 * 8);
            uVar34 = *(ulong *)(local_1578 + lVar28 * 8);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar34;
            auVar43 = vpandq_avx512vl(auVar60,auVar103._0_16_);
            auVar4 = vpmovzxwd_avx(auVar43);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(lVar6 + lVar32);
            auVar43 = vpaddd_avx(auVar64,auVar4);
            auVar65 = vpmulld_avx(auVar64,auVar4);
            auVar65 = vpsrlq_avx(auVar65,0x20);
            auVar43 = vpaddd_avx(auVar43,auVar65);
            lVar31 = CONCAT44((int)((ulong)local_1578 >> 0x20),auVar43._0_4_);
            p_Var8 = pGVar5[1].intersectionFilterN;
            auVar43 = *(undefined1 (*) [16])(lVar7 + (lVar31 + 1) * (long)p_Var8);
            uVar36 = *(ulong *)(lVar6 + lVar32) >> 0x20;
            lVar37 = lVar31 + uVar36 + 1;
            auVar65 = *(undefined1 (*) [16])(lVar7 + (lVar31 + uVar36) * (long)p_Var8);
            auVar44 = *(undefined1 (*) [16])(lVar7 + lVar37 * (long)p_Var8);
            uVar35 = (ulong)(-1 < (short)uVar34);
            auVar2 = *(undefined1 (*) [16])(lVar7 + (lVar31 + uVar35 + 1) * (long)p_Var8);
            lVar28 = uVar35 + lVar37;
            auVar3 = *(undefined1 (*) [16])(lVar7 + lVar28 * (long)p_Var8);
            uVar35 = 0;
            if (-1 < (short)(uVar34 >> 0x10)) {
              uVar35 = uVar36;
            }
            auVar59 = *(undefined1 (*) [16])(lVar7 + (lVar31 + uVar36 + uVar35) * (long)p_Var8);
            auVar63 = *(undefined1 (*) [16])(lVar7 + (lVar37 + uVar35) * (long)p_Var8);
            auVar81._16_16_ = *(undefined1 (*) [16])(lVar7 + (uVar35 + lVar28) * (long)p_Var8);
            auVar81._0_16_ = auVar44;
            auVar64 = vunpcklps_avx(auVar43,auVar3);
            auVar60 = vunpckhps_avx(auVar43,auVar3);
            auVar12 = vunpcklps_avx(auVar2,auVar44);
            auVar2 = vunpckhps_avx(auVar2,auVar44);
            auVar13 = vunpcklps_avx(auVar60,auVar2);
            auVar14 = vunpcklps_avx(auVar64,auVar12);
            auVar2 = vunpckhps_avx(auVar64,auVar12);
            auVar64 = vunpcklps_avx(auVar65,auVar63);
            auVar60 = vunpckhps_avx(auVar65,auVar63);
            auVar12 = vunpcklps_avx(auVar44,auVar59);
            auVar59 = vunpckhps_avx(auVar44,auVar59);
            auVar60 = vunpcklps_avx(auVar60,auVar59);
            auVar15 = vunpcklps_avx(auVar64,auVar12);
            auVar59 = vunpckhps_avx(auVar64,auVar12);
            auVar73._16_16_ = auVar63;
            auVar73._0_16_ = auVar65;
            auVar70._16_16_ = auVar3;
            auVar70._0_16_ = auVar43;
            auVar45 = vunpcklps_avx(auVar70,auVar73);
            auVar66._16_16_ = auVar44;
            auVar66._0_16_ = *(undefined1 (*) [16])(lVar7 + (long)p_Var8 * lVar31);
            auVar46 = vunpcklps_avx(auVar66,auVar81);
            auVar51 = vunpcklps_avx(auVar46,auVar45);
            auVar52 = vunpckhps_avx(auVar46,auVar45);
            auVar45 = vunpckhps_avx(auVar70,auVar73);
            auVar46 = vunpckhps_avx(auVar66,auVar81);
            auVar53 = vunpcklps_avx(auVar46,auVar45);
            auVar45._16_16_ = auVar14;
            auVar45._0_16_ = auVar14;
            auVar71._16_16_ = auVar2;
            auVar71._0_16_ = auVar2;
            auVar74._16_16_ = auVar13;
            auVar74._0_16_ = auVar13;
            auVar75._16_16_ = auVar15;
            auVar75._0_16_ = auVar15;
            auVar82._16_16_ = auVar59;
            auVar82._0_16_ = auVar59;
            auVar76._16_16_ = auVar60;
            auVar76._0_16_ = auVar60;
            auVar45 = vsubps_avx(auVar51,auVar45);
            auVar46 = vsubps_avx(auVar52,auVar71);
            auVar47 = vsubps_avx(auVar53,auVar74);
            auVar48 = vsubps_avx(auVar75,auVar51);
            auVar58 = vsubps_avx(auVar82,auVar52);
            auVar57 = vsubps_avx(auVar76,auVar53);
            auVar22._4_4_ = auVar46._4_4_ * auVar57._4_4_;
            auVar22._0_4_ = auVar46._0_4_ * auVar57._0_4_;
            auVar22._8_4_ = auVar46._8_4_ * auVar57._8_4_;
            auVar22._12_4_ = auVar46._12_4_ * auVar57._12_4_;
            auVar22._16_4_ = auVar46._16_4_ * auVar57._16_4_;
            auVar22._20_4_ = auVar46._20_4_ * auVar57._20_4_;
            auVar22._24_4_ = auVar46._24_4_ * auVar57._24_4_;
            auVar22._28_4_ = auVar2._12_4_;
            auVar43 = vfmsub231ps_fma(auVar22,auVar58,auVar47);
            auVar23._4_4_ = auVar47._4_4_ * auVar48._4_4_;
            auVar23._0_4_ = auVar47._0_4_ * auVar48._0_4_;
            auVar23._8_4_ = auVar47._8_4_ * auVar48._8_4_;
            auVar23._12_4_ = auVar47._12_4_ * auVar48._12_4_;
            auVar23._16_4_ = auVar47._16_4_ * auVar48._16_4_;
            auVar23._20_4_ = auVar47._20_4_ * auVar48._20_4_;
            auVar23._24_4_ = auVar47._24_4_ * auVar48._24_4_;
            auVar23._28_4_ = auVar13._12_4_;
            auVar65 = vfmsub231ps_fma(auVar23,auVar57,auVar45);
            auVar24._4_4_ = auVar45._4_4_ * auVar58._4_4_;
            auVar24._0_4_ = auVar45._0_4_ * auVar58._0_4_;
            auVar24._8_4_ = auVar45._8_4_ * auVar58._8_4_;
            auVar24._12_4_ = auVar45._12_4_ * auVar58._12_4_;
            auVar24._16_4_ = auVar45._16_4_ * auVar58._16_4_;
            auVar24._20_4_ = auVar45._20_4_ * auVar58._20_4_;
            auVar24._24_4_ = auVar45._24_4_ * auVar58._24_4_;
            auVar24._28_4_ = auVar15._12_4_;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
            auVar85._4_4_ = uVar1;
            auVar85._0_4_ = uVar1;
            auVar85._8_4_ = uVar1;
            auVar85._12_4_ = uVar1;
            auVar85._16_4_ = uVar1;
            auVar85._20_4_ = uVar1;
            auVar85._24_4_ = uVar1;
            auVar85._28_4_ = uVar1;
            auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
            auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
            uVar1 = *(undefined4 *)(ray + k * 4);
            auVar54._4_4_ = uVar1;
            auVar54._0_4_ = uVar1;
            auVar54._8_4_ = uVar1;
            auVar54._12_4_ = uVar1;
            auVar54._16_4_ = uVar1;
            auVar54._20_4_ = uVar1;
            auVar54._24_4_ = uVar1;
            auVar54._28_4_ = uVar1;
            auVar51 = vsubps_avx512vl(auVar51,auVar54);
            auVar44 = vfmsub231ps_fma(auVar24,auVar48,auVar46);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
            auVar55._4_4_ = uVar1;
            auVar55._0_4_ = uVar1;
            auVar55._8_4_ = uVar1;
            auVar55._12_4_ = uVar1;
            auVar55._16_4_ = uVar1;
            auVar55._20_4_ = uVar1;
            auVar55._24_4_ = uVar1;
            auVar55._28_4_ = uVar1;
            auVar52 = vsubps_avx512vl(auVar52,auVar55);
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar56._4_4_ = uVar1;
            auVar56._0_4_ = uVar1;
            auVar56._8_4_ = uVar1;
            auVar56._12_4_ = uVar1;
            auVar56._16_4_ = uVar1;
            auVar56._20_4_ = uVar1;
            auVar56._24_4_ = uVar1;
            auVar56._28_4_ = uVar1;
            auVar53 = vsubps_avx512vl(auVar53,auVar56);
            auVar54 = vmulps_avx512vl(auVar49,auVar53);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar52,auVar50);
            auVar55 = vmulps_avx512vl(auVar50,auVar51);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar53,auVar85);
            auVar56 = vmulps_avx512vl(auVar85,auVar52);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar49);
            auVar50 = vmulps_avx512vl(ZEXT1632(auVar44),auVar50);
            auVar49 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar65),auVar49);
            local_1300 = vfmadd231ps_avx512vl(auVar49,ZEXT1632(auVar43),auVar85);
            auVar50._8_4_ = 0x7fffffff;
            auVar50._0_8_ = 0x7fffffff7fffffff;
            auVar50._12_4_ = 0x7fffffff;
            auVar50._16_4_ = 0x7fffffff;
            auVar50._20_4_ = 0x7fffffff;
            auVar50._24_4_ = 0x7fffffff;
            auVar50._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_1300,auVar50);
            vandps_avx512vl(local_1300,auVar96._0_32_);
            auVar57 = vmulps_avx512vl(auVar57,auVar56);
            auVar58 = vfmadd231ps_avx512vl(auVar57,auVar55,auVar58);
            auVar48 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar48);
            fVar84 = local_1300._0_4_;
            auVar78._0_4_ = (float)((uint)fVar84 ^ auVar48._0_4_);
            fVar86 = local_1300._4_4_;
            auVar78._4_4_ = (float)((uint)fVar86 ^ auVar48._4_4_);
            fVar87 = local_1300._8_4_;
            auVar78._8_4_ = (float)((uint)fVar87 ^ auVar48._8_4_);
            fVar88 = local_1300._12_4_;
            auVar78._12_4_ = (float)((uint)fVar88 ^ auVar48._12_4_);
            fVar89 = local_1300._16_4_;
            auVar78._16_4_ = (float)((uint)fVar89 ^ auVar48._16_4_);
            fVar90 = local_1300._20_4_;
            auVar78._20_4_ = (float)((uint)fVar90 ^ auVar48._20_4_);
            fVar91 = local_1300._24_4_;
            auVar78._24_4_ = (float)((uint)fVar91 ^ auVar48._24_4_);
            uStack_1264 = local_1300._28_4_;
            auVar78._28_4_ = (float)(uStack_1264 ^ auVar48._28_4_);
            auVar47 = vmulps_avx512vl(auVar47,auVar56);
            auVar46 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar55);
            auVar45 = vfmadd231ps_avx512vl(auVar46,auVar45,auVar54);
            auVar83._0_4_ = (float)((uint)fVar84 ^ auVar45._0_4_);
            auVar83._4_4_ = (float)((uint)fVar86 ^ auVar45._4_4_);
            auVar83._8_4_ = (float)((uint)fVar87 ^ auVar45._8_4_);
            auVar83._12_4_ = (float)((uint)fVar88 ^ auVar45._12_4_);
            auVar83._16_4_ = (float)((uint)fVar89 ^ auVar45._16_4_);
            auVar83._20_4_ = (float)((uint)fVar90 ^ auVar45._20_4_);
            auVar83._24_4_ = (float)((uint)fVar91 ^ auVar45._24_4_);
            auVar83._28_4_ = (float)(uStack_1264 ^ auVar45._28_4_);
            uVar18 = vcmpps_avx512vl(auVar78,ZEXT832(0) << 0x20,5);
            uVar19 = vcmpps_avx512vl(auVar83,ZEXT832(0) << 0x20,5);
            uVar16 = vcmpps_avx512vl(local_1300,ZEXT832(0) << 0x20,4);
            auVar92._0_4_ = auVar78._0_4_ + auVar83._0_4_;
            auVar92._4_4_ = auVar78._4_4_ + auVar83._4_4_;
            auVar92._8_4_ = auVar78._8_4_ + auVar83._8_4_;
            auVar92._12_4_ = auVar78._12_4_ + auVar83._12_4_;
            auVar92._16_4_ = auVar78._16_4_ + auVar83._16_4_;
            auVar92._20_4_ = auVar78._20_4_ + auVar83._20_4_;
            auVar92._24_4_ = auVar78._24_4_ + auVar83._24_4_;
            auVar92._28_4_ = auVar78._28_4_ + auVar83._28_4_;
            uVar17 = vcmpps_avx512vl(auVar92,local_1300,2);
            local_12df = (byte)uVar18 & (byte)uVar19 & (byte)uVar16 & (byte)uVar17;
            if (local_12df != 0) {
              auVar25._4_4_ = auVar44._4_4_ * auVar53._4_4_;
              auVar25._0_4_ = auVar44._0_4_ * auVar53._0_4_;
              auVar25._8_4_ = auVar44._8_4_ * auVar53._8_4_;
              auVar25._12_4_ = auVar44._12_4_ * auVar53._12_4_;
              auVar25._16_4_ = auVar53._16_4_ * 0.0;
              auVar25._20_4_ = auVar53._20_4_ * 0.0;
              auVar25._24_4_ = auVar53._24_4_ * 0.0;
              auVar25._28_4_ = auVar53._28_4_;
              auVar2 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar65),auVar25);
              auVar2 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar43),ZEXT1632(auVar2));
              local_1320._0_4_ = (float)((uint)fVar84 ^ auVar2._0_4_);
              local_1320._4_4_ = (float)((uint)fVar86 ^ auVar2._4_4_);
              local_1320._8_4_ = (float)((uint)fVar87 ^ auVar2._8_4_);
              local_1320._12_4_ = (float)((uint)fVar88 ^ auVar2._12_4_);
              local_1320._16_4_ = fVar89;
              local_1320._20_4_ = fVar90;
              local_1320._24_4_ = fVar91;
              local_1320._28_4_ = uStack_1264;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
              auVar20._4_4_ = uVar1;
              auVar20._0_4_ = uVar1;
              auVar20._8_4_ = uVar1;
              auVar20._12_4_ = uVar1;
              auVar20._16_4_ = uVar1;
              auVar20._20_4_ = uVar1;
              auVar20._24_4_ = uVar1;
              auVar20._28_4_ = uVar1;
              auVar45 = vmulps_avx512vl(local_1300,auVar20);
              uVar18 = vcmpps_avx512vl(auVar45,local_1320,1);
              local_1520 = *(float *)(ray + k * 4 + 0x80);
              auVar26._4_4_ = local_1520 * fVar86;
              auVar26._0_4_ = local_1520 * fVar84;
              auVar26._8_4_ = local_1520 * fVar87;
              auVar26._12_4_ = local_1520 * fVar88;
              auVar26._16_4_ = local_1520 * fVar89;
              auVar26._20_4_ = local_1520 * fVar90;
              auVar26._24_4_ = local_1520 * fVar91;
              auVar26._28_4_ = auVar45._28_4_;
              uVar19 = vcmpps_avx512vl(local_1320,auVar26,2);
              local_12df = (byte)uVar18 & (byte)uVar19 & local_12df;
              if (local_12df != 0) {
                auVar45 = vsubps_avx(local_1300,auVar83);
                local_1360 = vblendps_avx(auVar78,auVar45,0xf0);
                auVar45 = vsubps_avx(local_1300,auVar78);
                local_1340 = vblendps_avx(auVar83,auVar45,0xf0);
                fVar77 = (float)DAT_01fef940;
                local_1260._0_4_ = fVar77 * auVar43._0_4_;
                fVar79 = DAT_01fef940._4_4_;
                local_1260._4_4_ = fVar79 * auVar43._4_4_;
                fVar62 = DAT_01fef940._8_4_;
                local_1260._8_4_ = fVar62 * auVar43._8_4_;
                fVar67 = DAT_01fef940._12_4_;
                local_1260._12_4_ = fVar67 * auVar43._12_4_;
                fVar68 = DAT_01fef940._16_4_;
                local_1260._16_4_ = fVar68 * 0.0;
                fVar69 = DAT_01fef940._20_4_;
                local_1260._20_4_ = fVar69 * 0.0;
                fVar80 = DAT_01fef940._24_4_;
                local_1260._24_4_ = fVar80 * 0.0;
                local_1260._28_4_ = 0;
                local_1240._4_4_ = fVar79 * auVar65._4_4_;
                local_1240._0_4_ = fVar77 * auVar65._0_4_;
                local_1240._8_4_ = fVar62 * auVar65._8_4_;
                local_1240._12_4_ = fVar67 * auVar65._12_4_;
                local_1240._16_4_ = fVar68 * 0.0;
                local_1240._20_4_ = fVar69 * 0.0;
                local_1240._24_4_ = fVar80 * 0.0;
                local_1240._28_4_ = 0;
                local_1220._4_4_ = fVar79 * auVar44._4_4_;
                local_1220._0_4_ = fVar77 * auVar44._0_4_;
                local_1220._8_4_ = fVar62 * auVar44._8_4_;
                local_1220._12_4_ = fVar67 * auVar44._12_4_;
                local_1220._16_4_ = fVar68 * 0.0;
                local_1220._20_4_ = fVar69 * 0.0;
                local_1220._24_4_ = fVar80 * 0.0;
                local_1220._28_4_ = 0;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_007b89b5:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar42;
                  }
                  auVar72._8_4_ = 1;
                  auVar72._0_8_ = 0x100000001;
                  auVar72._12_4_ = 1;
                  auVar72._16_4_ = 1;
                  auVar72._20_4_ = 1;
                  auVar72._24_4_ = 1;
                  auVar72._28_4_ = 1;
                  auVar45 = vpermd_avx2(auVar72,ZEXT1632(auVar4));
                  auVar46 = vpaddd_avx2(auVar45,_DAT_01fec4c0);
                  auVar61._0_4_ = auVar4._0_4_;
                  auVar61._4_4_ = auVar61._0_4_;
                  auVar61._8_4_ = auVar61._0_4_;
                  auVar61._12_4_ = auVar61._0_4_;
                  auVar61._16_4_ = auVar61._0_4_;
                  auVar61._20_4_ = auVar61._0_4_;
                  auVar61._24_4_ = auVar61._0_4_;
                  auVar61._28_4_ = auVar61._0_4_;
                  auVar45 = vpaddd_avx2(auVar61,_DAT_01fec4a0);
                  auVar43 = vcvtsi2ss_avx512f(auVar93._0_16_,*(ushort *)(lVar6 + 8 + lVar32) - 1);
                  auVar12._12_4_ = 0;
                  auVar12._0_12_ = ZEXT812(0);
                  auVar65 = vrcp14ss_avx512f(auVar12 << 0x20,ZEXT416(auVar43._0_4_));
                  auVar43 = vfnmadd213ss_fma(auVar43,auVar65,SUB6416(ZEXT464(0x40000000),0));
                  fVar77 = auVar65._0_4_ * auVar43._0_4_;
                  auVar43 = vcvtsi2ss_avx512f(auVar93._0_16_,*(ushort *)(lVar6 + 10 + lVar32) - 1);
                  auVar65 = vrcp14ss_avx512f(auVar12 << 0x20,ZEXT416(auVar43._0_4_));
                  auVar43 = vfnmadd213ss_fma(auVar43,auVar65,SUB6416(ZEXT464(0x40000000),0));
                  fVar79 = auVar65._0_4_ * auVar43._0_4_;
                  auVar45 = vcvtdq2ps_avx(auVar45);
                  fStack_12a4 = auVar45._28_4_ + local_1360._28_4_;
                  auVar46 = vcvtdq2ps_avx(auVar46);
                  auVar47 = vrcp14ps_avx512vl(local_1300);
                  auVar21._8_4_ = 0x3f800000;
                  auVar21._0_8_ = 0x3f8000003f800000;
                  auVar21._12_4_ = 0x3f800000;
                  auVar21._16_4_ = 0x3f800000;
                  auVar21._20_4_ = 0x3f800000;
                  auVar21._24_4_ = 0x3f800000;
                  auVar21._28_4_ = 0x3f800000;
                  auVar48 = vfnmadd213ps_avx512vl(local_1300,auVar47,auVar21);
                  auVar43 = vfmadd132ps_fma(auVar48,auVar47,auVar47);
                  fVar62 = auVar43._0_4_;
                  fVar67 = auVar43._4_4_;
                  fVar68 = auVar43._8_4_;
                  fVar69 = auVar43._12_4_;
                  local_1280[0] = fVar62 * local_1320._0_4_;
                  local_1280[1] = fVar67 * local_1320._4_4_;
                  local_1280[2] = fVar68 * local_1320._8_4_;
                  local_1280[3] = fVar69 * local_1320._12_4_;
                  fStack_1270 = fVar89 * 0.0;
                  fStack_126c = fVar90 * 0.0;
                  fStack_1268 = fVar91 * 0.0;
                  local_12c0[0] = (fVar84 * auVar45._0_4_ + local_1360._0_4_) * fVar77 * fVar62;
                  local_12c0[1] = (fVar86 * auVar45._4_4_ + local_1360._4_4_) * fVar77 * fVar67;
                  local_12c0[2] = (fVar87 * auVar45._8_4_ + local_1360._8_4_) * fVar77 * fVar68;
                  local_12c0[3] = (fVar88 * auVar45._12_4_ + local_1360._12_4_) * fVar77 * fVar69;
                  fStack_12b0 = (fVar89 * auVar45._16_4_ + local_1360._16_4_) * fVar77 * 0.0;
                  fStack_12ac = (fVar90 * auVar45._20_4_ + local_1360._20_4_) * fVar77 * 0.0;
                  fStack_12a8 = (fVar91 * auVar45._24_4_ + local_1360._24_4_) * fVar77 * 0.0;
                  local_12a0[0] = (fVar84 * auVar46._0_4_ + local_1340._0_4_) * fVar79 * fVar62;
                  local_12a0[1] = (fVar86 * auVar46._4_4_ + local_1340._4_4_) * fVar79 * fVar67;
                  local_12a0[2] = (fVar87 * auVar46._8_4_ + local_1340._8_4_) * fVar79 * fVar68;
                  local_12a0[3] = (fVar88 * auVar46._12_4_ + local_1340._12_4_) * fVar79 * fVar69;
                  fStack_1290 = (fVar89 * auVar46._16_4_ + local_1340._16_4_) * fVar79 * 0.0;
                  fStack_128c = (fVar90 * auVar46._20_4_ + local_1340._20_4_) * fVar79 * 0.0;
                  fStack_1288 = (fVar91 * auVar46._24_4_ + local_1340._24_4_) * fVar79 * 0.0;
                  fStack_1284 = fStack_12a4;
                  uVar34 = 0;
                  uVar36 = (ulong)local_12df;
                  for (uVar35 = uVar36; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
                      ) {
                    uVar34 = uVar34 + 1;
                  }
                  auVar43 = vpbroadcastd_avx512vl();
                  local_1530 = vpbroadcastd_avx512vl();
                  local_1420 = auVar93._0_32_;
                  local_1440 = auVar94._0_32_;
                  local_1460 = auVar95._0_32_;
                  local_1480 = auVar97._0_32_;
                  local_14a0 = auVar98._0_32_;
                  local_14c0 = vmovdqa64_avx512vl(auVar99._0_32_);
                  local_14e0 = vmovdqa64_avx512vl(auVar100._0_32_);
                  local_1500 = auVar101._0_32_;
                  local_1570 = vmovdqa64_avx512vl(auVar102._0_16_);
                  fStack_151c = local_1520;
                  fStack_1518 = local_1520;
                  fStack_1514 = local_1520;
                  fStack_1510 = local_1520;
                  fStack_150c = local_1520;
                  fStack_1508 = local_1520;
                  fStack_1504 = local_1520;
                  do {
                    local_13c0 = local_12c0[uVar34];
                    local_13b0 = local_12a0[uVar34];
                    *(float *)(ray + k * 4 + 0x80) = local_1280[uVar34];
                    local_1560.context = context->user;
                    local_13f0 = *(undefined4 *)(local_1260 + uVar34 * 4);
                    local_13e0 = *(undefined4 *)(local_1240 + uVar34 * 4);
                    local_13d0 = *(undefined4 *)(local_1220 + uVar34 * 4);
                    local_13a0 = local_1530._0_8_;
                    uStack_1398 = local_1530._8_8_;
                    vpcmpeqd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar43));
                    uStack_137c = (local_1560.context)->instID[0];
                    local_1380 = uStack_137c;
                    uStack_1378 = uStack_137c;
                    uStack_1374 = uStack_137c;
                    uStack_1370 = (local_1560.context)->instPrimID[0];
                    uStack_136c = uStack_1370;
                    uStack_1368 = uStack_1370;
                    uStack_1364 = uStack_1370;
                    local_1600 = vmovdqa64_avx512vl(auVar102._0_16_);
                    local_1560.valid = (int *)local_1600;
                    local_1560.geometryUserPtr = pGVar5->userPtr;
                    local_1560.hit = (RTCHitN *)&local_13f0;
                    local_1560.N = 4;
                    auVar65 = vmovdqa64_avx512vl(auVar102._0_16_);
                    local_1560.ray = (RTCRayN *)ray;
                    uStack_13ec = local_13f0;
                    uStack_13e8 = local_13f0;
                    uStack_13e4 = local_13f0;
                    uStack_13dc = local_13e0;
                    uStack_13d8 = local_13e0;
                    uStack_13d4 = local_13e0;
                    uStack_13cc = local_13d0;
                    uStack_13c8 = local_13d0;
                    uStack_13c4 = local_13d0;
                    fStack_13bc = local_13c0;
                    fStack_13b8 = local_13c0;
                    fStack_13b4 = local_13c0;
                    fStack_13ac = local_13b0;
                    fStack_13a8 = local_13b0;
                    fStack_13a4 = local_13b0;
                    local_1390 = auVar43;
                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar5->occlusionFilterN)(&local_1560);
                      auVar65 = local_1600;
                    }
                    uVar35 = vptestmd_avx512vl(auVar65,auVar65);
                    if ((uVar35 & 0xf) == 0) {
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar46 = vmovdqa64_avx512vl(local_14c0);
                      auVar45 = vmovdqa64_avx512vl(local_14e0);
                      auVar65 = vmovdqa64_avx512vl(local_1570);
                      auVar44 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_1560);
                        auVar65 = local_1600;
                      }
                      uVar35 = vptestmd_avx512vl(auVar65,auVar65);
                      uVar35 = uVar35 & 0xf;
                      auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar41 = (bool)((byte)uVar35 & 1);
                      bVar9 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar11 = SUB81(uVar35 >> 3,0);
                      *(uint *)(local_1560.ray + 0x80) =
                           (uint)bVar41 * auVar65._0_4_ |
                           (uint)!bVar41 * *(int *)(local_1560.ray + 0x80);
                      *(uint *)(local_1560.ray + 0x84) =
                           (uint)bVar9 * auVar65._4_4_ |
                           (uint)!bVar9 * *(int *)(local_1560.ray + 0x84);
                      *(uint *)(local_1560.ray + 0x88) =
                           (uint)bVar10 * auVar65._8_4_ |
                           (uint)!bVar10 * *(int *)(local_1560.ray + 0x88);
                      *(uint *)(local_1560.ray + 0x8c) =
                           (uint)bVar11 * auVar65._12_4_ |
                           (uint)!bVar11 * *(int *)(local_1560.ray + 0x8c);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar46 = vmovdqa64_avx512vl(local_14c0);
                      auVar45 = vmovdqa64_avx512vl(local_14e0);
                      auVar65 = vmovdqa64_avx512vl(local_1570);
                      auVar44 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                      if ((byte)uVar35 != 0) goto LAB_007b89b5;
                    }
                    auVar103 = ZEXT1664(auVar44);
                    auVar102 = ZEXT1664(auVar65);
                    auVar101 = ZEXT3264(local_1500);
                    auVar100 = ZEXT3264(auVar45);
                    auVar99 = ZEXT3264(auVar46);
                    auVar98 = ZEXT3264(local_14a0);
                    auVar97 = ZEXT3264(local_1480);
                    auVar96 = ZEXT3264(auVar47);
                    auVar95 = ZEXT3264(local_1460);
                    auVar94 = ZEXT3264(local_1440);
                    auVar93 = ZEXT3264(local_1420);
                    *(float *)(ray + k * 4 + 0x80) = local_1520;
                    uVar35 = uVar34 & 0x3f;
                    uVar34 = 0;
                    uVar36 = uVar36 ^ 1L << uVar35;
                    for (uVar35 = uVar36; (uVar35 & 1) == 0;
                        uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                      uVar34 = uVar34 + 1;
                    }
                  } while (uVar36 != 0);
                }
              }
            }
            uVar33 = uVar33 - 1 & uVar33;
          } while (uVar33 != 0);
        }
        local_1580 = local_1580 + 1;
      } while (local_1580 != local_1588);
    }
    bVar42 = local_15c0 != &local_1200;
    uVar33 = local_15c8;
    uVar34 = local_15d0;
    uVar35 = local_15d8;
    uVar36 = local_15e0;
    uVar39 = local_15f0;
    uVar40 = local_15e8;
joined_r0x007b8012:
    if (!bVar42) {
      return bVar42;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }